

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O1

nh_bool set_command_keys(win_menu *mdat,wchar_t idx)

{
  byte *pbVar1;
  nh_menuitem_conflict *pnVar2;
  char cVar3;
  char *pcVar4;
  nh_cmd_desc *pnVar5;
  nh_menuitem_conflict *items;
  wchar_t wVar6;
  ulong uVar7;
  wchar_t wVar8;
  wchar_t icount;
  long lVar9;
  int selection [1];
  wchar_t count;
  wchar_t local_13c;
  int local_138 [66];
  
  wVar8 = mdat->items[idx].id;
  if ((ulong)(uint)wVar8 == 0xffffd8f0) {
    local_138[0] = 0;
    init_keymap();
    pcVar4 = (char *)nh_get_commands(local_138);
    lVar9 = (long)local_138[0];
    if (0 < lVar9) {
      do {
        pnVar5 = find_command(pcVar4);
        if (pnVar5 != (nh_cmd_desc *)0x0) {
          pnVar5->flags = *(uint *)(pcVar4 + 0x68);
        }
        pcVar4 = pcVar4 + 0x6c;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    return '\x01';
  }
  pnVar5 = commandlist + ((ulong)(uint)wVar8 - 1);
  if (wVar8 < L'\0') {
    pnVar5 = builtin_commands + (uint)~wVar8;
  }
  items = (nh_menuitem_conflict *)malloc(0xa78);
  wVar8 = L'\n';
LAB_0010b9c1:
  do {
    lVar9 = 0;
    uVar7 = 0;
    do {
      do {
        do {
          do {
            if (keymap[lVar9] == pnVar5) {
              pcVar4 = curses_keyname((wchar_t)lVar9);
              sprintf((char *)local_138,"delete key %s",pcVar4);
              wVar6 = (wchar_t)uVar7;
              if (wVar8 <= wVar6) {
                wVar8 = wVar8 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar8 * 0x10c);
              }
              pnVar2 = items + wVar6;
              pnVar2->id = (wchar_t)lVar9;
              pnVar2->role = MI_NORMAL;
              pnVar2->accel = '\0';
              pnVar2->group_accel = '\0';
              pnVar2->selected = '\0';
              strcpy(pnVar2->caption,(char *)local_138);
              uVar7 = (ulong)(uint)(wVar6 + L'\x01');
            }
            wVar6 = (wchar_t)uVar7;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x1ff);
          if (L'\0' < wVar6) {
            if (wVar8 <= wVar6) {
              wVar8 = wVar8 * 2;
              items = (nh_menuitem_conflict *)realloc(items,(long)wVar8 * 0x10c);
            }
            items[uVar7].id = L'\0';
            items[uVar7].role = MI_NORMAL;
            items[uVar7].accel = '\0';
            items[uVar7].group_accel = '\0';
            items[uVar7].selected = '\0';
            items[uVar7].caption[0] = '\0';
            wVar6 = wVar6 + L'\x01';
          }
          if (wVar8 <= wVar6) {
            wVar8 = wVar8 * 2;
            items = (nh_menuitem_conflict *)realloc(items,(long)wVar8 * 0x10c);
          }
          items[wVar6].id = L'\xffffffff';
          items[wVar6].role = MI_NORMAL;
          items[wVar6].accel = '+';
          items[wVar6].group_accel = '\0';
          items[wVar6].selected = '\0';
          builtin_strncpy(items[wVar6].caption,"Add a ne",8);
          builtin_strncpy(items[wVar6].caption + 6,"new key",8);
          icount = wVar6 + L'\x01';
          if (-1 < (int)pnVar5->flags) {
            if ((pnVar5->flags >> 10 & 1) == 0) {
              if (wVar8 <= icount) {
                wVar8 = wVar8 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar8 * 0x10c);
              }
              items[icount].id = L'\xfffffffe';
              items[icount].role = MI_NORMAL;
              items[icount].accel = '\0';
              items[icount].group_accel = '\0';
              items[icount].selected = '\0';
              builtin_strncpy(items[icount].caption,"Use as an extend",0x10);
              builtin_strncpy(items[icount].caption + 0xb,"xtended command",0x10);
            }
            else {
              if (wVar8 <= icount) {
                wVar8 = wVar8 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)wVar8 * 0x10c);
              }
              items[icount].id = L'\xfffffffe';
              items[icount].role = MI_NORMAL;
              items[icount].accel = '\0';
              items[icount].group_accel = '\0';
              items[icount].selected = '\0';
              builtin_strncpy(items[icount].caption,"Don\'t use as an ",0x10);
              builtin_strncpy(items[icount].caption + 0x10,"extended command",0x10);
              items[icount].caption[0x20] = '\0';
            }
            icount = wVar6 + L'\x02';
          }
          sprintf((char *)local_138,"Key bindings for %s",pnVar5);
          wVar6 = curses_display_menu(items,icount,(char *)local_138,L'\x01',&local_13c);
          if (wVar6 < L'\x01') {
            free(items);
            return '\x01';
          }
          if (0 < (long)local_13c) {
            keymap[local_13c] = (nh_cmd_desc *)0x0;
            goto LAB_0010b9c1;
          }
          if (local_13c == L'\xfffffffe') {
            pbVar1 = (byte *)((long)&pnVar5->flags + 1);
            *pbVar1 = *pbVar1 ^ 4;
            goto LAB_0010b9c1;
          }
          lVar9 = 0;
          uVar7 = 0;
        } while (local_13c != L'\xffffffff');
        lVar9 = 0;
        sprintf((char *)local_138,"Press the key you want to use for \"%s\"",pnVar5);
        wVar6 = curses_msgwin((char *)local_138);
        uVar7 = 0;
      } while (0x1fe < (uint)wVar6 || wVar6 == L'\x1b');
      if (keymap[(uint)wVar6] == (nh_cmd_desc *)0x0) break;
      lVar9 = 0;
      sprintf((char *)local_138,"That key is already in use by \"%s\"! Replace?");
      cVar3 = curses_yn_function((char *)local_138,"yn",'n');
      uVar7 = 0;
    } while (cVar3 != 'y');
    keymap[(uint)wVar6] = pnVar5;
  } while( true );
}

Assistant:

static nh_bool set_command_keys(struct win_menu *mdat, int idx)
{
    int id = mdat->items[idx].id;
    struct nh_cmd_desc *cmd, *cmdlist;
    
    if (id == RESET_BINDINGS_ID) {
	int i, count = 0;
	init_keymap(); /* fully reset the keymap */
	
	/* reset extcmds */
	cmdlist = nh_get_commands(&count);
	for (i = 0; i < count; i++) {
	    cmd = find_command(cmdlist[i].name);
	    if (cmd)
		cmd->flags = cmdlist[i].flags;
	}
	
	return TRUE;
    }
    
    if (id < 0)
	cmd = &builtin_commands[-(id+1)];
    else
	cmd = &commandlist[id-1];
    
    command_settings_menu(cmd);
    
    return TRUE;
}